

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  int *piVar8;
  _func_int **pp_Var9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined4 uVar24;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar31;
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  unkbyte10 Var34;
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  unkbyte10 Var37;
  undefined1 auVar38 [12];
  Mat *pMVar39;
  undefined8 uVar40;
  undefined1 uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  undefined4 *puVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  int iVar52;
  int iVar53;
  _func_int *p_Var54;
  size_type __n;
  float fVar55;
  float fVar85;
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  Layer *pLVar56;
  int iVar57;
  Option *_elemsize;
  Option *opt_00;
  int iVar58;
  uint _elempack;
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [16];
  int iVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  ushort uVar64;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  int iVar73;
  ushort uVar75;
  int iVar76;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ushort uVar74;
  ushort uVar77;
  undefined1 auVar68 [16];
  float fVar83;
  v4sf one;
  undefined1 auVar81 [16];
  undefined1 auVar84 [12];
  int iVar86;
  float fVar87;
  int iVar102;
  int iVar104;
  int iVar106;
  float fVar107;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  float fVar105;
  float fVar108;
  undefined1 auVar101 [16];
  float fVar109;
  char cVar122;
  char cVar123;
  char cVar124;
  char cVar125;
  float fVar126;
  char cVar127;
  char cVar128;
  float fVar129;
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar130;
  float fVar131;
  float fVar144;
  float fVar145;
  undefined1 auVar132 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  undefined1 auVar143 [16];
  int iVar147;
  short sVar152;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined4 uVar156;
  undefined4 uVar157;
  undefined4 uVar158;
  undefined4 uVar159;
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  int local_330;
  float *local_328;
  undefined1 local_318 [48];
  undefined1 local_2e8 [16];
  size_t local_2d8;
  ulong local_2c8;
  _func_int **local_2c0;
  float *local_2b8;
  Mat *local_2b0;
  Mat local_2a8;
  pointer local_260;
  Mat local_258;
  long local_208;
  long local_200;
  pointer local_1f8;
  ulong local_1f0;
  pointer local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  int local_1d0;
  Allocator *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  int local_1b0;
  ulong local_1a8;
  void *local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  int local_180;
  Allocator *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  int local_160;
  ulong local_158;
  Mat local_148;
  undefined1 local_f8 [16];
  long local_e8;
  _func_int **local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  undefined4 uVar26;
  undefined3 uVar28;
  undefined2 uVar30;
  short sVar78;
  undefined1 auVar82 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar148 [12];
  undefined1 auVar149 [16];
  
  local_148.elempack = bottom_blob->elempack;
  local_148.c = bottom_blob->c;
  if (local_148.elempack == 0) {
    bVar62 = false;
  }
  else {
    bVar62 = ((int)bottom_blob->elemsize << 3) / local_148.elempack == 8;
  }
  p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar43 = *(int *)(&this->field_0xd4 + (long)p_Var54);
  iVar52 = *(int *)(&this->field_0xdc + (long)p_Var54);
  iVar58 = *(int *)(&this->field_0xd8 + (long)p_Var54);
  iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var54);
  local_148.data = bottom_blob->data;
  piVar8 = bottom_blob->refcount;
  local_148.refcount._0_4_ = SUB84(piVar8,0);
  local_148.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
  local_148.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_148.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_148.allocator = bottom_blob->allocator;
  local_148.dims = bottom_blob->dims;
  local_148.w = bottom_blob->w;
  local_148.h = bottom_blob->h;
  local_148.d = bottom_blob->d;
  local_148.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  if (!bVar62) {
    uVar50 = (long)(local_148.elempack * local_148.c) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
    local_2a8.cstep = 0;
    local_2a8.data = (undefined4 *)0x0;
    local_2a8.refcount._0_4_ = 0;
    local_2a8.refcount._4_4_ = 0;
    local_2a8.elemsize._0_4_ = 0;
    local_2a8.elemsize._4_4_ = 0;
    local_2a8.elempack = 0;
    local_2a8.allocator = (Allocator *)0x0;
    local_2a8.dims = 0;
    local_2a8.w = 0;
    local_2a8.h = 0;
    local_2a8.d = 0;
    local_2a8.c = 0;
    Mat::create(&local_2a8,local_148.elempack * local_148.c,4,(Allocator *)0x0);
    pp_Var9 = this->_vptr_ConvolutionDepthWise_x86;
    p_Var54 = pp_Var9[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
      lVar47 = 0;
      puVar46 = (undefined4 *)local_2a8.data;
      do {
        if (0 < (int)uVar50) {
          uVar156 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var54) + lVar47 * 4);
          uVar49 = uVar50 & 0xffffffff;
          do {
            *puVar46 = uVar156;
            puVar46 = puVar46 + 1;
            uVar51 = (int)uVar49 - 1;
            uVar49 = (ulong)uVar51;
          } while (uVar51 != 0);
        }
        lVar47 = lVar47 + 1;
        p_Var54 = pp_Var9[-3];
      } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
    }
    local_318._0_8_ = *(undefined8 *)opt;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    local_318._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    local_318._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_2e8._0_4_ = opt->flush_denormals;
    local_2e8[4] = opt->use_local_pool_allocator;
    local_2e8[5] = opt->use_shader_local_memory;
    local_2e8[6] = opt->use_cooperative_matrix;
    local_2e8[7] = opt->use_winograd23_convolution;
    local_2e8[8] = opt->use_winograd43_convolution;
    local_2e8[9] = opt->use_winograd63_convolution;
    local_2e8[10] = opt->use_a53_a55_optimized_kernel;
    local_2e8[0xb] = opt->use_reserved_7;
    local_2e8[0xc] = opt->use_reserved_8;
    local_2e8[0xd] = opt->use_reserved_9;
    local_2e8[0xe] = opt->use_reserved_10;
    local_2e8[0xf] = opt->use_reserved_11;
    local_318._16_4_ = SUB84(opt->workspace_allocator,0);
    local_318._20_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_318._8_4_ = SUB84(opt->workspace_allocator,0);
    local_318._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_318._24_4_ = uVar16;
    local_318._28_4_ = uVar18;
    quantize_to_int8(bottom_blob,&local_148,&local_2a8,(Option *)local_318);
    piVar8 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_2a8.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_2a8.data != (undefined4 *)0x0) {
            free(local_2a8.data);
          }
        }
        else {
          (*(local_2a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_2a8.cstep = 0;
  local_2a8.data = (pointer)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),&local_148,&local_2a8,opt);
  iVar61 = -100;
  local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if (((pointer)local_2a8.data == (pointer)0x0) ||
     (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
     (long)local_2a8.c * local_2a8.cstep == 0)) goto LAB_003f867d;
  local_f8._0_4_ = local_2a8.w;
  p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar43 = (~((iVar43 + -1) * iVar52) + local_2a8.w) / *(int *)(&this->field_0xe4 + (long)p_Var54);
  iVar52 = iVar43 + 1;
  uVar50 = (long)(~((iVar58 + -1) * iVar45) + local_2a8.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var54);
  local_1f0 = uVar50 & 0xffffffff;
  iVar58 = (int)uVar50 + 1;
  local_200 = CONCAT44(local_200._4_4_,local_2a8.elempack);
  uVar51 = local_2a8.c * local_2a8.elempack;
  if ((uVar51 == *(uint *)(&this->field_0x108 + (long)p_Var54)) &&
     (uVar42 = *(uint *)(&this->field_0xd0 + (long)p_Var54),
     *(uint *)(&this->field_0x108 + (long)p_Var54) == uVar42)) {
    uVar51 = 8;
    if (opt->use_packing_layout == false) {
      uVar51 = 1;
    }
    if ((uVar42 & 7) != 0) {
      uVar51 = 1;
    }
    opt_00 = (Option *)(ulong)uVar51;
    iVar45 = *(int *)(&this->field_0x10c + (long)p_Var54);
    _elemsize = (Option *)(ulong)(uVar51 * 4);
    if (100 < iVar45) {
      _elemsize = opt_00;
    }
    local_260 = (pointer)(ulong)(uint)local_2a8.c;
    Mat::create(top_blob,iVar52,iVar58,(int)uVar42 / (int)uVar51,(size_t)_elemsize,uVar51,
                opt->blob_allocator);
    local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
    if ((top_blob->data == (void *)0x0) ||
       (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
       (long)top_blob->c * top_blob->cstep == 0)) goto LAB_003f867d;
    iVar61 = 0;
    if ((int)local_200 != 1) {
      local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if ((int)local_200 != 8) goto LAB_003f867d;
      uVar50 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_318,uVar50,(allocator_type *)&local_258)
      ;
      pp_Var9 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var54 = pp_Var9[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var54)) {
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar58 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var54);
        iVar53 = 0;
        fVar55 = 0.0;
        iVar57 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var9[-3])) {
            lVar47 = 0;
            do {
              *(float *)(local_318._0_8_ + (iVar53 + lVar47) * 4) = fVar55;
              fVar55 = (float)((int)fVar55 + *(int *)(&this->field_0xdc + (long)pp_Var9[-3]));
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 < *(int *)(&this->field_0xd4 + (long)pp_Var9[-3]));
            iVar53 = iVar53 + (int)lVar47;
          }
          fVar55 = (float)((int)fVar55 + (iVar52 * local_f8._0_4_ - iVar58 * iVar61));
          iVar57 = iVar57 + 1;
          opt_00 = (Option *)pp_Var9[-3];
        } while (iVar57 < *(int *)(&this->field_0xd8 + (long)opt_00));
      }
      auVar81 = _DAT_005952a0;
      if (0 < (int)local_260) {
        iVar52 = (int)uVar50 * 8;
        local_208 = CONCAT44(local_208._4_4_,iVar52);
        local_2c8 = 0;
        auVar63._0_12_ = ZEXT812(0);
        auVar63._12_4_ = 0;
        uVar156 = 0x42b0c0a5;
        uVar157 = 0x42b0c0a5;
        uVar158 = 0x42b0c0a5;
        uVar159 = 0x42b0c0a5;
        fVar55 = (float)DAT_005952a0;
        fVar83 = DAT_005952a0._4_4_;
        fVar85 = DAT_005952a0._8_4_;
        local_1f8 = (pointer)0x0;
        do {
          if (-1 < (int)local_1f0) {
            local_2c0 = (_func_int **)
                        (local_2a8.cstep * (long)local_1f8 *
                         CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize) +
                        (long)local_2a8.data);
            pauVar59 = (undefined1 (*) [16])
                       (top_blob->elemsize * (long)local_1f8 * top_blob->cstep +
                       (long)top_blob->data);
            pp_Var9 = this->_vptr_ConvolutionDepthWise_x86;
            opt_00 = (Option *)((long)local_1f8 * 8);
            pvVar10 = (this->weight_data_tm).data;
            pauVar60 = pauVar59;
            iVar58 = 0;
            do {
              if (-1 < iVar43) {
                local_2b8 = (float *)(long)iVar58;
                iVar61 = 0;
                do {
                  p_Var54 = pp_Var9[-3];
                  if ((int)uVar50 < 1) {
                    auVar140 = ZEXT816(0);
                    auVar93 = ZEXT816(0);
                  }
                  else {
                    iVar53 = 0;
                    iVar57 = 0;
                    iVar73 = 0;
                    iVar76 = 0;
                    uVar49 = 0;
                    iVar86 = 0;
                    iVar102 = 0;
                    iVar104 = 0;
                    iVar106 = 0;
                    do {
                      uVar7 = *(ulong *)((long)local_2c0 +
                                        (long)(int)*(pointer)(local_318._0_8_ + uVar49 * 4) * 8 +
                                        (long)*(int *)(&this->field_0xe8 + (long)p_Var54) *
                                        (long)local_2b8 *
                                        (long)local_2a8.w *
                                        CONCAT44(local_2a8.elemsize._4_4_,
                                                 (undefined4)local_2a8.elemsize) +
                                        (long)(*(int *)(&this->field_0xe4 + (long)p_Var54) * iVar61
                                              * 8));
                      cVar122 = (char)(uVar7 >> 8);
                      cVar123 = (char)(uVar7 >> 0x10);
                      cVar124 = (char)(uVar7 >> 0x18);
                      cVar125 = (char)(uVar7 >> 0x20);
                      cVar127 = (char)(uVar7 >> 0x28);
                      cVar128 = (char)(uVar7 >> 0x30);
                      auVar115._8_6_ = 0;
                      auVar115._0_8_ = uVar7;
                      auVar115[0xe] = (char)(uVar7 >> 0x38);
                      auVar115[0xf] = -((long)uVar7 < 0);
                      auVar114._14_2_ = auVar115._14_2_;
                      auVar114._8_5_ = 0;
                      auVar114._0_8_ = uVar7;
                      auVar114[0xd] = -(cVar128 < '\0');
                      auVar113._13_3_ = auVar114._13_3_;
                      auVar113._8_4_ = 0;
                      auVar113._0_8_ = uVar7;
                      auVar113[0xc] = cVar128;
                      auVar142._12_4_ = auVar113._12_4_;
                      auVar142._8_3_ = 0;
                      auVar142._0_8_ = uVar7;
                      auVar142[0xb] = -(cVar127 < '\0');
                      auVar154._11_5_ = auVar142._11_5_;
                      auVar154._8_2_ = 0;
                      auVar154._0_8_ = uVar7;
                      auVar154[10] = cVar127;
                      auVar112._10_6_ = auVar154._10_6_;
                      auVar112[8] = 0;
                      auVar112._0_8_ = uVar7;
                      auVar112[9] = -(cVar125 < '\0');
                      auVar111._9_7_ = auVar112._9_7_;
                      auVar111[8] = cVar125;
                      auVar111._0_8_ = uVar7;
                      Var34 = CONCAT91(CONCAT81(auVar111._8_8_,-(cVar124 < '\0')),cVar124);
                      auVar33._2_10_ = Var34;
                      auVar33[1] = -(cVar123 < '\0');
                      auVar33[0] = cVar123;
                      auVar32._2_12_ = auVar33;
                      auVar32[1] = -(cVar122 < '\0');
                      auVar32[0] = cVar122;
                      auVar110._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar110._2_14_ = auVar32;
                      uVar7 = *(ulong *)((long)pvVar10 + uVar49 * 8 + (long)(int)(uint)local_2c8);
                      cVar122 = (char)(uVar7 >> 8);
                      cVar123 = (char)(uVar7 >> 0x10);
                      cVar124 = (char)(uVar7 >> 0x18);
                      cVar125 = (char)(uVar7 >> 0x20);
                      cVar127 = (char)(uVar7 >> 0x28);
                      cVar128 = (char)(uVar7 >> 0x30);
                      auVar139._8_6_ = 0;
                      auVar139._0_8_ = uVar7;
                      auVar139[0xe] = (char)(uVar7 >> 0x38);
                      auVar139[0xf] = -((long)uVar7 < 0);
                      auVar138._14_2_ = auVar139._14_2_;
                      auVar138._8_5_ = 0;
                      auVar138._0_8_ = uVar7;
                      auVar138[0xd] = -(cVar128 < '\0');
                      auVar137._13_3_ = auVar138._13_3_;
                      auVar137._8_4_ = 0;
                      auVar137._0_8_ = uVar7;
                      auVar137[0xc] = cVar128;
                      auVar136._12_4_ = auVar137._12_4_;
                      auVar136._8_3_ = 0;
                      auVar136._0_8_ = uVar7;
                      auVar136[0xb] = -(cVar127 < '\0');
                      auVar135._11_5_ = auVar136._11_5_;
                      auVar135._8_2_ = 0;
                      auVar135._0_8_ = uVar7;
                      auVar135[10] = cVar127;
                      auVar134._10_6_ = auVar135._10_6_;
                      auVar134[8] = 0;
                      auVar134._0_8_ = uVar7;
                      auVar134[9] = -(cVar125 < '\0');
                      auVar133._9_7_ = auVar134._9_7_;
                      auVar133[8] = cVar125;
                      auVar133._0_8_ = uVar7;
                      Var37 = CONCAT91(CONCAT81(auVar133._8_8_,-(cVar124 < '\0')),cVar124);
                      auVar36._2_10_ = Var37;
                      auVar36[1] = -(cVar123 < '\0');
                      auVar36[0] = cVar123;
                      auVar35._2_12_ = auVar36;
                      auVar35[1] = -(cVar122 < '\0');
                      auVar35[0] = cVar122;
                      auVar132._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar132._2_14_ = auVar35;
                      sVar152 = (short)Var37 * (short)Var34;
                      auVar140 = pmulhw(auVar132,auVar110);
                      iVar147 = CONCAT22(auVar140._6_2_,sVar152);
                      Var34 = CONCAT64(CONCAT42(iVar147,auVar140._4_2_),
                                       CONCAT22(auVar36._0_2_ * auVar33._0_2_,sVar152));
                      auVar38._4_8_ = (long)((unkuint10)Var34 >> 0x10);
                      auVar38._2_2_ = auVar140._2_2_;
                      auVar38._0_2_ = auVar35._0_2_ * auVar32._0_2_;
                      iVar53 = iVar53 + CONCAT22(auVar140._0_2_,auVar132._0_2_ * auVar110._0_2_);
                      iVar57 = iVar57 + auVar38._0_4_;
                      iVar73 = iVar73 + (int)((unkuint10)Var34 >> 0x10);
                      iVar76 = iVar76 + iVar147;
                      iVar147 = CONCAT22(auVar140._8_2_,auVar133._8_2_ * auVar111._8_2_);
                      auVar148._0_8_ =
                           CONCAT26(auVar140._10_2_,
                                    CONCAT24(auVar135._10_2_ * auVar154._10_2_,iVar147));
                      auVar148._8_2_ = auVar137._12_2_ * auVar113._12_2_;
                      auVar148._10_2_ = auVar140._12_2_;
                      auVar149._12_2_ = auVar138._14_2_ * auVar114._14_2_;
                      auVar149._0_12_ = auVar148;
                      auVar149._14_2_ = auVar140._14_2_;
                      iVar86 = iVar86 + iVar147;
                      iVar102 = iVar102 + (int)((ulong)auVar148._0_8_ >> 0x20);
                      iVar104 = iVar104 + auVar148._8_4_;
                      iVar106 = iVar106 + auVar149._12_4_;
                      uVar49 = uVar49 + 1;
                    } while ((uVar50 & 0xffffffff) != uVar49);
                    auVar93._0_4_ = (float)iVar53;
                    auVar93._4_4_ = (float)iVar57;
                    auVar93._8_4_ = (float)iVar73;
                    auVar93._12_4_ = (float)iVar76;
                    auVar140._0_4_ = (float)iVar86;
                    auVar140._4_4_ = (float)iVar102;
                    auVar140._8_4_ = (float)iVar104;
                    auVar140._12_4_ = (float)iVar106;
                  }
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var54) +
                                    (long)local_1f8 * 0x20);
                  pfVar3 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var54) + 0x10 +
                                    (long)local_1f8 * 0x20);
                  pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) +
                                    (long)local_1f8 * 0x20);
                  pfVar4 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + 0x10 +
                                    (long)local_1f8 * 0x20);
                  auVar141._0_4_ = *pfVar1 * *pfVar2;
                  auVar141._4_4_ = pfVar1[1] * pfVar2[1];
                  auVar141._8_4_ = pfVar1[2] * pfVar2[2];
                  auVar141._12_4_ = pfVar1[3] * pfVar2[3];
                  auVar142 = rcpps(auVar141,auVar141);
                  auVar153._0_4_ = *pfVar3 * *pfVar4;
                  auVar153._4_4_ = pfVar3[1] * pfVar4[1];
                  auVar153._8_4_ = pfVar3[2] * pfVar4[2];
                  auVar153._12_4_ = pfVar3[3] * pfVar4[3];
                  auVar154 = rcpps(auVar153,auVar153);
                  auVar65._0_4_ = (float)(-(uint)(*pfVar2 != 0.0) & auVar142._0_4_) * auVar93._0_4_;
                  auVar65._4_4_ =
                       (float)(-(uint)(pfVar2[1] != 0.0) & auVar142._4_4_) * auVar93._4_4_;
                  auVar65._8_4_ =
                       (float)(-(uint)(pfVar2[2] != 0.0) & auVar142._8_4_) * auVar93._8_4_;
                  auVar65._12_4_ =
                       (float)(-(uint)(pfVar2[3] != 0.0) & auVar142._12_4_) * auVar93._12_4_;
                  auVar150._0_4_ =
                       (float)(-(uint)(*pfVar4 != 0.0) & auVar154._0_4_) * auVar140._0_4_;
                  auVar150._4_4_ =
                       (float)(-(uint)(pfVar4[1] != 0.0) & auVar154._4_4_) * auVar140._4_4_;
                  auVar150._8_4_ =
                       (float)(-(uint)(pfVar4[2] != 0.0) & auVar154._8_4_) * auVar140._8_4_;
                  auVar150._12_4_ =
                       (float)(-(uint)(pfVar4[3] != 0.0) & auVar154._12_4_) * auVar140._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var54) != 0) {
                    auVar140 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1b0 + (long)p_Var54) +
                                (long)local_1f8 * 0x20);
                    auVar93 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var54) + 0x10 +
                               (long)local_1f8 * 0x20);
                    auVar65._0_4_ = auVar65._0_4_ + auVar140._0_4_;
                    auVar65._4_4_ = auVar65._4_4_ + auVar140._4_4_;
                    auVar65._8_4_ = auVar65._8_4_ + auVar140._8_4_;
                    auVar65._12_4_ = auVar65._12_4_ + auVar140._12_4_;
                    auVar150._0_4_ = auVar150._0_4_ + auVar93._0_4_;
                    auVar150._4_4_ = auVar150._4_4_ + auVar93._4_4_;
                    auVar150._8_4_ = auVar150._8_4_ + auVar93._8_4_;
                    auVar150._12_4_ = auVar150._12_4_ + auVar93._12_4_;
                  }
                  iVar53 = *(int *)(&this->field_0x110 + (long)p_Var54) + -1;
                  fVar109 = auVar81._12_4_;
                  fVar87 = auVar65._0_4_;
                  fVar103 = auVar65._4_4_;
                  fVar105 = auVar65._8_4_;
                  fVar108 = auVar65._12_4_;
                  switch(iVar53) {
                  case 0:
                    auVar65 = maxps(auVar65,auVar63);
                    break;
                  case 1:
                    auVar93 = maxps(auVar65,auVar63);
                    auVar140 = minps(auVar65,auVar63);
                    fVar87 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    auVar65._4_4_ = fVar87 * auVar140._4_4_ + auVar93._4_4_;
                    auVar65._0_4_ = fVar87 * auVar140._0_4_ + auVar93._0_4_;
                    auVar65._8_4_ = fVar87 * auVar140._8_4_ + auVar93._8_4_;
                    auVar65._12_4_ = fVar87 * auVar140._12_4_ + auVar93._12_4_;
                    break;
                  case 2:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar91._4_4_ = uVar5;
                    auVar91._0_4_ = uVar5;
                    auVar91._8_4_ = uVar5;
                    auVar91._12_4_ = uVar5;
                    auVar117._4_4_ = uVar6;
                    auVar117._0_4_ = uVar6;
                    auVar117._8_4_ = uVar6;
                    auVar117._12_4_ = uVar6;
                    auVar140 = maxps(auVar65,auVar91);
                    auVar65 = minps(auVar140,auVar117);
                    break;
                  case 3:
                    auVar66._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
                    auVar66._8_4_ = -fVar105;
                    auVar66._12_4_ = -fVar108;
                    auVar12._4_4_ = uVar157;
                    auVar12._0_4_ = uVar156;
                    auVar12._8_4_ = uVar158;
                    auVar12._12_4_ = uVar159;
                    auVar140 = minps(auVar66,auVar12);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar103 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar108 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar129 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar87 = (float)(int)fVar103;
                    fVar105 = (float)(int)fVar108;
                    fVar126 = (float)(int)fVar129;
                    fVar130 = (float)(int)fVar107;
                    fVar87 = fVar87 - (float)(-(uint)(fVar103 < fVar87) & (uint)fVar55);
                    fVar105 = fVar105 - (float)(-(uint)(fVar108 < fVar105) & (uint)fVar83);
                    fVar126 = fVar126 - (float)(-(uint)(fVar129 < fVar126) & (uint)fVar85);
                    fVar130 = fVar130 - (float)(-(uint)(fVar107 < fVar130) & (uint)fVar109);
                    fVar103 = fVar87 * -0.6931472 + auVar140._0_4_;
                    fVar108 = fVar105 * -0.6931472 + auVar140._4_4_;
                    fVar129 = fVar126 * -0.6931472 + auVar140._8_4_;
                    fVar107 = fVar130 * -0.6931472 + auVar140._12_4_;
                    auVar92._0_4_ =
                         fVar103 + fVar55 +
                         (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                            fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                         fVar103 * fVar103;
                    auVar92._4_4_ =
                         fVar108 + fVar83 +
                         (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                            fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                         fVar108 * fVar108;
                    auVar92._8_4_ =
                         fVar129 + fVar85 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129;
                    auVar92._12_4_ =
                         fVar107 + fVar109 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    auVar118._0_4_ =
                         (float)((int)fVar87 * 0x800000 + (int)fVar55) * auVar92._0_4_ + fVar55;
                    auVar118._4_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar83) * auVar92._4_4_ + fVar83;
                    auVar118._8_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar85) * auVar92._8_4_ + fVar85;
                    auVar118._12_4_ =
                         (float)((int)fVar130 * 0x800000 + (int)fVar109) * auVar92._12_4_ + fVar109;
                    auVar140 = rcpps(auVar92,auVar118);
                    fVar87 = auVar140._0_4_;
                    fVar103 = auVar140._4_4_;
                    fVar105 = auVar140._8_4_;
                    fVar108 = auVar140._12_4_;
                    auVar65._0_4_ = (fVar55 - auVar118._0_4_ * fVar87) * fVar87 + fVar87;
                    auVar65._4_4_ = (fVar83 - auVar118._4_4_ * fVar103) * fVar103 + fVar103;
                    auVar65._8_4_ = (fVar85 - auVar118._8_4_ * fVar105) * fVar105 + fVar105;
                    auVar65._12_4_ = (fVar109 - auVar118._12_4_ * fVar108) * fVar108 + fVar108;
                    break;
                  case 4:
                    auVar11._4_4_ = uVar157;
                    auVar11._0_4_ = uVar156;
                    auVar11._8_4_ = uVar158;
                    auVar11._12_4_ = uVar159;
                    auVar140 = minps(auVar65,auVar11);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar126 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar129 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar130 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar131 = (float)(int)fVar126;
                    fVar144 = (float)(int)fVar129;
                    fVar145 = (float)(int)fVar130;
                    fVar146 = (float)(int)fVar107;
                    fVar131 = fVar131 - (float)(-(uint)(fVar126 < fVar131) & (uint)fVar55);
                    fVar144 = fVar144 - (float)(-(uint)(fVar129 < fVar144) & (uint)fVar83);
                    fVar145 = fVar145 - (float)(-(uint)(fVar130 < fVar145) & (uint)fVar85);
                    fVar146 = fVar146 - (float)(-(uint)(fVar107 < fVar146) & (uint)fVar109);
                    fVar126 = auVar140._0_4_ - fVar131 * 0.6931472;
                    fVar129 = auVar140._4_4_ - fVar144 * 0.6931472;
                    fVar130 = auVar140._8_4_ - fVar145 * 0.6931472;
                    fVar107 = auVar140._12_4_ - fVar146 * 0.6931472;
                    auVar88._0_4_ =
                         (float)((int)fVar131 * 0x800000 + (int)fVar55) *
                         (fVar126 + fVar55 +
                         (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                            fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) *
                         fVar126 * fVar126) + fVar55;
                    auVar88._4_4_ =
                         (float)((int)fVar144 * 0x800000 + (int)fVar83) *
                         (fVar129 + fVar83 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129) + fVar83;
                    auVar88._8_4_ =
                         (float)((int)fVar145 * 0x800000 + (int)fVar85) *
                         (fVar130 + fVar85 +
                         (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) *
                            fVar130 + 0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5) *
                         fVar130 * fVar130) + fVar85;
                    auVar88._12_4_ =
                         (float)((int)fVar146 * 0x800000 + (int)fVar109) *
                         (fVar107 + fVar109 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107) + fVar109;
                    auVar140 = maxps(auVar88,_DAT_00595310);
                    fVar126 = (float)(auVar140._0_4_ & 0x807fffff | 0x3f000000);
                    fVar130 = (float)(auVar140._4_4_ & 0x807fffff | 0x3f000000);
                    fVar131 = (float)(auVar140._8_4_ & 0x807fffff | 0x3f000000);
                    fVar145 = (float)(auVar140._12_4_ & 0x807fffff | 0x3f000000);
                    fVar129 = fVar126 + -1.0 +
                              (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
                    fVar107 = fVar130 + -1.0 +
                              (float)(-(uint)(fVar130 < 0.70710677) & (uint)fVar130);
                    fVar144 = fVar131 + -1.0 +
                              (float)(-(uint)(fVar131 < 0.70710677) & (uint)fVar131);
                    fVar146 = fVar145 + -1.0 +
                              (float)(-(uint)(fVar145 < 0.70710677) & (uint)fVar145);
                    auVar89._0_4_ =
                         ~-(uint)(auVar88._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar55)) * 0.6931472
                                 + fVar129 +
                                (((((((((fVar129 * 0.070376836 + -0.1151461) * fVar129 + 0.116769984
                                       ) * fVar129 + -0.12420141) * fVar129 + 0.14249323) * fVar129
                                    + -0.16668057) * fVar129 + 0.20000714) * fVar129 + -0.24999994)
                                  * fVar129 + 0.3333333) * fVar129 + -0.5) * fVar129 * fVar129) *
                               -2.0);
                    auVar89._4_4_ =
                         ~-(uint)(auVar88._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar130 < 0.70710677) & (uint)fVar83)) * 0.6931472
                                 + fVar107 +
                                (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984
                                       ) * fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107
                                    + -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994)
                                  * fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) *
                               -2.0);
                    auVar89._8_4_ =
                         ~-(uint)(auVar88._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar131 < 0.70710677) & (uint)fVar85)) * 0.6931472
                                 + fVar144 +
                                (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984
                                       ) * fVar144 + -0.12420141) * fVar144 + 0.14249323) * fVar144
                                    + -0.16668057) * fVar144 + 0.20000714) * fVar144 + -0.24999994)
                                  * fVar144 + 0.3333333) * fVar144 + -0.5) * fVar144 * fVar144) *
                               -2.0);
                    auVar89._12_4_ =
                         ~-(uint)(auVar88._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar145 < 0.70710677) & (uint)fVar109)) * 0.6931472
                                 + fVar146 +
                                (((((((((fVar146 * 0.070376836 + -0.1151461) * fVar146 + 0.116769984
                                       ) * fVar146 + -0.12420141) * fVar146 + 0.14249323) * fVar146
                                    + -0.16668057) * fVar146 + 0.20000714) * fVar146 + -0.24999994)
                                  * fVar146 + 0.3333333) * fVar146 + -0.5) * fVar146 * fVar146) *
                               -2.0);
                    auVar143._0_8_ =
                         CONCAT44(-(uint)(auVar88._4_4_ <= 0.0),-(uint)(auVar88._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar143._8_4_ = -(uint)(auVar88._8_4_ <= 0.0) & 0x7fffffff;
                    auVar143._12_4_ = -(uint)(auVar88._12_4_ <= 0.0) & 0x7fffffff;
                    auVar140 = minps(auVar143 | auVar89,_DAT_00595260);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar131 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar144 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar145 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar146 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar126 = (float)(int)fVar131;
                    fVar129 = (float)(int)fVar144;
                    fVar130 = (float)(int)fVar145;
                    fVar107 = (float)(int)fVar146;
                    fVar126 = fVar126 - (float)(-(uint)(fVar131 < fVar126) & (uint)fVar55);
                    fVar129 = fVar129 - (float)(-(uint)(fVar144 < fVar129) & (uint)fVar83);
                    fVar130 = fVar130 - (float)(-(uint)(fVar145 < fVar130) & (uint)fVar85);
                    fVar107 = fVar107 - (float)(-(uint)(fVar146 < fVar107) & (uint)fVar109);
                    fVar131 = auVar140._0_4_ - fVar126 * 0.6931472;
                    fVar144 = auVar140._4_4_ - fVar129 * 0.6931472;
                    fVar145 = auVar140._8_4_ - fVar130 * 0.6931472;
                    fVar146 = auVar140._12_4_ - fVar107 * 0.6931472;
                    auVar90._0_4_ = fVar131 * fVar131;
                    auVar90._4_4_ = fVar144 * fVar144;
                    auVar90._8_4_ = fVar145 * fVar145;
                    auVar90._12_4_ = fVar146 * fVar146;
                    auVar116._0_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar55) *
                         (fVar131 + fVar55 +
                         (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                            fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5) *
                         auVar90._0_4_) + fVar55;
                    auVar116._4_4_ =
                         (float)((int)fVar129 * 0x800000 + (int)fVar83) *
                         (fVar144 + fVar83 +
                         (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) *
                            fVar144 + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5) *
                         auVar90._4_4_) + fVar83;
                    auVar116._8_4_ =
                         (float)((int)fVar130 * 0x800000 + (int)fVar85) *
                         (fVar145 + fVar85 +
                         (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) *
                            fVar145 + 0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) *
                         auVar90._8_4_) + fVar85;
                    auVar116._12_4_ =
                         (float)((int)fVar107 * 0x800000 + (int)fVar109) *
                         (fVar146 + fVar109 +
                         (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) *
                            fVar146 + 0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5) *
                         auVar90._12_4_) + fVar109;
                    auVar140 = rcpps(auVar90,auVar116);
                    fVar126 = auVar140._0_4_;
                    fVar129 = auVar140._4_4_;
                    fVar130 = auVar140._8_4_;
                    fVar107 = auVar140._12_4_;
                    auVar65._0_4_ =
                         fVar87 * (fVar126 + fVar126 + -1.0 +
                                  (2.0 - auVar116._0_4_ * (fVar126 + fVar126)) * fVar126);
                    auVar65._4_4_ =
                         fVar103 * (fVar129 + fVar129 + -1.0 +
                                   (2.0 - auVar116._4_4_ * (fVar129 + fVar129)) * fVar129);
                    auVar65._8_4_ =
                         fVar105 * (fVar130 + fVar130 + -1.0 +
                                   (2.0 - auVar116._8_4_ * (fVar130 + fVar130)) * fVar130);
                    auVar65._12_4_ =
                         fVar108 * (fVar107 + fVar107 + -1.0 +
                                   (2.0 - auVar116._12_4_ * (fVar107 + fVar107)) * fVar107);
                    uVar156 = (int)DAT_00595260;
                    uVar157 = DAT_00595260._4_4_;
                    uVar158 = DAT_00595260._8_4_;
                    uVar159 = DAT_00595260._12_4_;
                    break;
                  case 5:
                    fVar126 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    fVar129 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar94._0_4_ = fVar126 * fVar87 + fVar129;
                    auVar94._4_4_ = fVar126 * fVar103 + fVar129;
                    auVar94._8_4_ = fVar126 * fVar105 + fVar129;
                    auVar94._12_4_ = fVar126 * fVar108 + fVar129;
                    auVar140 = maxps(auVar94,auVar63);
                    auVar140 = minps(auVar140,auVar81);
                    auVar65._0_4_ = fVar87 * auVar140._0_4_;
                    auVar65._4_4_ = fVar103 * auVar140._4_4_;
                    auVar65._8_4_ = fVar105 * auVar140._8_4_;
                    auVar65._12_4_ = fVar108 * auVar140._12_4_;
                  }
                  fVar87 = auVar150._0_4_;
                  fVar103 = auVar150._4_4_;
                  fVar105 = auVar150._8_4_;
                  fVar108 = auVar150._12_4_;
                  switch(iVar53) {
                  case 0:
                    auVar150 = maxps(auVar150,auVar63);
                    break;
                  case 1:
                    auVar140 = maxps(auVar150,auVar63);
                    auVar93 = minps(auVar150,auVar63);
                    fVar87 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    auVar150._4_4_ = fVar87 * auVar93._4_4_ + auVar140._4_4_;
                    auVar150._0_4_ = fVar87 * auVar93._0_4_ + auVar140._0_4_;
                    auVar150._8_4_ = fVar87 * auVar93._8_4_ + auVar140._8_4_;
                    auVar150._12_4_ = fVar87 * auVar93._12_4_ + auVar140._12_4_;
                    break;
                  case 2:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar98._4_4_ = uVar5;
                    auVar98._0_4_ = uVar5;
                    auVar98._8_4_ = uVar5;
                    auVar98._12_4_ = uVar5;
                    auVar120._4_4_ = uVar6;
                    auVar120._0_4_ = uVar6;
                    auVar120._8_4_ = uVar6;
                    auVar120._12_4_ = uVar6;
                    auVar140 = maxps(auVar150,auVar98);
                    auVar150 = minps(auVar140,auVar120);
                    break;
                  case 3:
                    auVar151._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
                    auVar151._8_4_ = -fVar105;
                    auVar151._12_4_ = -fVar108;
                    auVar14._4_4_ = uVar157;
                    auVar14._0_4_ = uVar156;
                    auVar14._8_4_ = uVar158;
                    auVar14._12_4_ = uVar159;
                    auVar140 = minps(auVar151,auVar14);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar103 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar108 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar129 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar87 = (float)(int)fVar103;
                    fVar105 = (float)(int)fVar108;
                    fVar126 = (float)(int)fVar129;
                    fVar130 = (float)(int)fVar107;
                    fVar87 = fVar87 - (float)(-(uint)(fVar103 < fVar87) & (uint)fVar55);
                    fVar105 = fVar105 - (float)(-(uint)(fVar108 < fVar105) & (uint)fVar83);
                    fVar126 = fVar126 - (float)(-(uint)(fVar129 < fVar126) & (uint)fVar85);
                    fVar130 = fVar130 - (float)(-(uint)(fVar107 < fVar130) & (uint)fVar109);
                    fVar103 = fVar87 * -0.6931472 + auVar140._0_4_;
                    fVar108 = fVar105 * -0.6931472 + auVar140._4_4_;
                    fVar129 = fVar126 * -0.6931472 + auVar140._8_4_;
                    fVar107 = fVar130 * -0.6931472 + auVar140._12_4_;
                    auVar99._0_4_ =
                         fVar103 + fVar55 +
                         (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                            fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + 0.5) *
                         fVar103 * fVar103;
                    auVar99._4_4_ =
                         fVar108 + fVar83 +
                         (((((fVar108 * 0.00019875691 + 0.0013981999) * fVar108 + 0.008333452) *
                            fVar108 + 0.041665796) * fVar108 + 0.16666666) * fVar108 + 0.5) *
                         fVar108 * fVar108;
                    auVar99._8_4_ =
                         fVar129 + fVar85 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129;
                    auVar99._12_4_ =
                         fVar107 + fVar109 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107;
                    auVar121._0_4_ =
                         (float)((int)fVar87 * 0x800000 + (int)fVar55) * auVar99._0_4_ + fVar55;
                    auVar121._4_4_ =
                         (float)((int)fVar105 * 0x800000 + (int)fVar83) * auVar99._4_4_ + fVar83;
                    auVar121._8_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar85) * auVar99._8_4_ + fVar85;
                    auVar121._12_4_ =
                         (float)((int)fVar130 * 0x800000 + (int)fVar109) * auVar99._12_4_ + fVar109;
                    auVar140 = rcpps(auVar99,auVar121);
                    fVar87 = auVar140._0_4_;
                    fVar103 = auVar140._4_4_;
                    fVar105 = auVar140._8_4_;
                    fVar108 = auVar140._12_4_;
                    auVar150._0_4_ = (fVar55 - auVar121._0_4_ * fVar87) * fVar87 + fVar87;
                    auVar150._4_4_ = (fVar83 - auVar121._4_4_ * fVar103) * fVar103 + fVar103;
                    auVar150._8_4_ = (fVar85 - auVar121._8_4_ * fVar105) * fVar105 + fVar105;
                    auVar150._12_4_ = (fVar109 - auVar121._12_4_ * fVar108) * fVar108 + fVar108;
                    break;
                  case 4:
                    auVar13._4_4_ = uVar157;
                    auVar13._0_4_ = uVar156;
                    auVar13._8_4_ = uVar158;
                    auVar13._12_4_ = uVar159;
                    auVar140 = minps(auVar150,auVar13);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar126 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar129 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar130 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar107 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar131 = (float)(int)fVar126;
                    fVar144 = (float)(int)fVar129;
                    fVar145 = (float)(int)fVar130;
                    fVar146 = (float)(int)fVar107;
                    fVar131 = fVar131 - (float)(-(uint)(fVar126 < fVar131) & (uint)fVar55);
                    fVar144 = fVar144 - (float)(-(uint)(fVar129 < fVar144) & (uint)fVar83);
                    fVar145 = fVar145 - (float)(-(uint)(fVar130 < fVar145) & (uint)fVar85);
                    fVar146 = fVar146 - (float)(-(uint)(fVar107 < fVar146) & (uint)fVar109);
                    fVar126 = auVar140._0_4_ - fVar131 * 0.6931472;
                    fVar129 = auVar140._4_4_ - fVar144 * 0.6931472;
                    fVar130 = auVar140._8_4_ - fVar145 * 0.6931472;
                    fVar107 = auVar140._12_4_ - fVar146 * 0.6931472;
                    auVar95._0_4_ =
                         (float)((int)fVar131 * 0x800000 + (int)fVar55) *
                         (fVar126 + fVar55 +
                         (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                            fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) *
                         fVar126 * fVar126) + fVar55;
                    auVar95._4_4_ =
                         (float)((int)fVar144 * 0x800000 + (int)fVar83) *
                         (fVar129 + fVar83 +
                         (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) *
                            fVar129 + 0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5) *
                         fVar129 * fVar129) + fVar83;
                    auVar95._8_4_ =
                         (float)((int)fVar145 * 0x800000 + (int)fVar85) *
                         (fVar130 + fVar85 +
                         (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) *
                            fVar130 + 0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5) *
                         fVar130 * fVar130) + fVar85;
                    auVar95._12_4_ =
                         (float)((int)fVar146 * 0x800000 + (int)fVar109) *
                         (fVar107 + fVar109 +
                         (((((fVar107 * 0.00019875691 + 0.0013981999) * fVar107 + 0.008333452) *
                            fVar107 + 0.041665796) * fVar107 + 0.16666666) * fVar107 + 0.5) *
                         fVar107 * fVar107) + fVar109;
                    auVar140 = maxps(auVar95,_DAT_00595310);
                    fVar126 = (float)(auVar140._0_4_ & 0x807fffff | 0x3f000000);
                    fVar130 = (float)(auVar140._4_4_ & 0x807fffff | 0x3f000000);
                    fVar131 = (float)(auVar140._8_4_ & 0x807fffff | 0x3f000000);
                    fVar145 = (float)(auVar140._12_4_ & 0x807fffff | 0x3f000000);
                    fVar129 = fVar126 + -1.0 +
                              (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
                    fVar107 = fVar130 + -1.0 +
                              (float)(-(uint)(fVar130 < 0.70710677) & (uint)fVar130);
                    fVar144 = fVar131 + -1.0 +
                              (float)(-(uint)(fVar131 < 0.70710677) & (uint)fVar131);
                    fVar146 = fVar145 + -1.0 +
                              (float)(-(uint)(fVar145 < 0.70710677) & (uint)fVar145);
                    auVar96._0_4_ =
                         ~-(uint)(auVar95._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar55)) * 0.6931472
                                 + fVar129 +
                                (((((((((fVar129 * 0.070376836 + -0.1151461) * fVar129 + 0.116769984
                                       ) * fVar129 + -0.12420141) * fVar129 + 0.14249323) * fVar129
                                    + -0.16668057) * fVar129 + 0.20000714) * fVar129 + -0.24999994)
                                  * fVar129 + 0.3333333) * fVar129 + -0.5) * fVar129 * fVar129) *
                               -2.0);
                    auVar96._4_4_ =
                         ~-(uint)(auVar95._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar130 < 0.70710677) & (uint)fVar83)) * 0.6931472
                                 + fVar107 +
                                (((((((((fVar107 * 0.070376836 + -0.1151461) * fVar107 + 0.116769984
                                       ) * fVar107 + -0.12420141) * fVar107 + 0.14249323) * fVar107
                                    + -0.16668057) * fVar107 + 0.20000714) * fVar107 + -0.24999994)
                                  * fVar107 + 0.3333333) * fVar107 + -0.5) * fVar107 * fVar107) *
                               -2.0);
                    auVar96._8_4_ =
                         ~-(uint)(auVar95._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar131 < 0.70710677) & (uint)fVar85)) * 0.6931472
                                 + fVar144 +
                                (((((((((fVar144 * 0.070376836 + -0.1151461) * fVar144 + 0.116769984
                                       ) * fVar144 + -0.12420141) * fVar144 + 0.14249323) * fVar144
                                    + -0.16668057) * fVar144 + 0.20000714) * fVar144 + -0.24999994)
                                  * fVar144 + 0.3333333) * fVar144 + -0.5) * fVar144 * fVar144) *
                               -2.0);
                    auVar96._12_4_ =
                         ~-(uint)(auVar95._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar140._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar145 < 0.70710677) & (uint)fVar109)) * 0.6931472
                                 + fVar146 +
                                (((((((((fVar146 * 0.070376836 + -0.1151461) * fVar146 + 0.116769984
                                       ) * fVar146 + -0.12420141) * fVar146 + 0.14249323) * fVar146
                                    + -0.16668057) * fVar146 + 0.20000714) * fVar146 + -0.24999994)
                                  * fVar146 + 0.3333333) * fVar146 + -0.5) * fVar146 * fVar146) *
                               -2.0);
                    auVar155._0_8_ =
                         CONCAT44(-(uint)(auVar95._4_4_ <= 0.0),-(uint)(auVar95._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar155._8_4_ = -(uint)(auVar95._8_4_ <= 0.0) & 0x7fffffff;
                    auVar155._12_4_ = -(uint)(auVar95._12_4_ <= 0.0) & 0x7fffffff;
                    auVar140 = minps(auVar155 | auVar96,_DAT_00595260);
                    auVar140 = maxps(auVar140,_DAT_00595270);
                    fVar131 = auVar140._0_4_ * 1.442695 + 0.5;
                    fVar144 = auVar140._4_4_ * 1.442695 + 0.5;
                    fVar145 = auVar140._8_4_ * 1.442695 + 0.5;
                    fVar146 = auVar140._12_4_ * 1.442695 + 0.5;
                    fVar126 = (float)(int)fVar131;
                    fVar129 = (float)(int)fVar144;
                    fVar130 = (float)(int)fVar145;
                    fVar107 = (float)(int)fVar146;
                    fVar126 = fVar126 - (float)(-(uint)(fVar131 < fVar126) & (uint)fVar55);
                    fVar129 = fVar129 - (float)(-(uint)(fVar144 < fVar129) & (uint)fVar83);
                    fVar130 = fVar130 - (float)(-(uint)(fVar145 < fVar130) & (uint)fVar85);
                    fVar107 = fVar107 - (float)(-(uint)(fVar146 < fVar107) & (uint)fVar109);
                    fVar131 = auVar140._0_4_ - fVar126 * 0.6931472;
                    fVar144 = auVar140._4_4_ - fVar129 * 0.6931472;
                    fVar145 = auVar140._8_4_ - fVar130 * 0.6931472;
                    fVar146 = auVar140._12_4_ - fVar107 * 0.6931472;
                    auVar97._0_4_ = fVar131 * fVar131;
                    auVar97._4_4_ = fVar144 * fVar144;
                    auVar97._8_4_ = fVar145 * fVar145;
                    auVar97._12_4_ = fVar146 * fVar146;
                    auVar119._0_4_ =
                         (float)((int)fVar126 * 0x800000 + (int)fVar55) *
                         (fVar131 + fVar55 +
                         (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                            fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5) *
                         auVar97._0_4_) + fVar55;
                    auVar119._4_4_ =
                         (float)((int)fVar129 * 0x800000 + (int)fVar83) *
                         (fVar144 + fVar83 +
                         (((((fVar144 * 0.00019875691 + 0.0013981999) * fVar144 + 0.008333452) *
                            fVar144 + 0.041665796) * fVar144 + 0.16666666) * fVar144 + 0.5) *
                         auVar97._4_4_) + fVar83;
                    auVar119._8_4_ =
                         (float)((int)fVar130 * 0x800000 + (int)fVar85) *
                         (fVar145 + fVar85 +
                         (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) *
                            fVar145 + 0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) *
                         auVar97._8_4_) + fVar85;
                    auVar119._12_4_ =
                         (float)((int)fVar107 * 0x800000 + (int)fVar109) *
                         (fVar146 + fVar109 +
                         (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) *
                            fVar146 + 0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5) *
                         auVar97._12_4_) + fVar109;
                    auVar140 = rcpps(auVar97,auVar119);
                    fVar109 = auVar140._0_4_;
                    fVar126 = auVar140._4_4_;
                    fVar129 = auVar140._8_4_;
                    fVar130 = auVar140._12_4_;
                    auVar150._0_4_ =
                         fVar87 * (fVar109 + fVar109 + -1.0 +
                                  (2.0 - auVar119._0_4_ * (fVar109 + fVar109)) * fVar109);
                    auVar150._4_4_ =
                         fVar103 * (fVar126 + fVar126 + -1.0 +
                                   (2.0 - auVar119._4_4_ * (fVar126 + fVar126)) * fVar126);
                    auVar150._8_4_ =
                         fVar105 * (fVar129 + fVar129 + -1.0 +
                                   (2.0 - auVar119._8_4_ * (fVar129 + fVar129)) * fVar129);
                    auVar150._12_4_ =
                         fVar108 * (fVar130 + fVar130 + -1.0 +
                                   (2.0 - auVar119._12_4_ * (fVar130 + fVar130)) * fVar130);
                    uVar156 = (int)DAT_00595260;
                    uVar157 = DAT_00595260._4_4_;
                    uVar158 = DAT_00595260._8_4_;
                    uVar159 = DAT_00595260._12_4_;
                    break;
                  case 5:
                    fVar109 = **(float **)(&this->field_0x118 + (long)p_Var54);
                    fVar126 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                    auVar100._0_4_ = fVar109 * fVar87 + fVar126;
                    auVar100._4_4_ = fVar109 * fVar103 + fVar126;
                    auVar100._8_4_ = fVar109 * fVar105 + fVar126;
                    auVar100._12_4_ = fVar109 * fVar108 + fVar126;
                    auVar140 = maxps(auVar100,auVar63);
                    auVar140 = minps(auVar140,auVar81);
                    auVar150._0_4_ = fVar87 * auVar140._0_4_;
                    auVar150._4_4_ = fVar103 * auVar140._4_4_;
                    auVar150._8_4_ = fVar105 * auVar140._8_4_;
                    auVar150._12_4_ = fVar108 * auVar140._12_4_;
                  }
                  if (iVar45 < 0x65) {
                    *pauVar59 = auVar65;
                    pauVar59[1] = auVar150;
                    pauVar59 = pauVar59 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var54) +
                                      (long)local_1f8 * 0x20);
                    pfVar2 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var54) + 0x10 +
                                      (long)local_1f8 * 0x20);
                    fVar87 = *pfVar1 * auVar65._0_4_;
                    fVar103 = pfVar1[1] * auVar65._4_4_;
                    fVar105 = pfVar1[2] * auVar65._8_4_;
                    fVar108 = pfVar1[3] * auVar65._12_4_;
                    fVar109 = *pfVar2 * auVar150._0_4_;
                    fVar126 = pfVar2[1] * auVar150._4_4_;
                    fVar129 = pfVar2[2] * auVar150._8_4_;
                    fVar130 = pfVar2[3] * auVar150._12_4_;
                    auVar67._0_4_ = (int)((float)((uint)fVar87 & 0x80000000 | 0x3f000000) + fVar87);
                    auVar67._4_4_ =
                         (int)((float)((uint)fVar103 & 0x80000000 | 0x3f000000) + fVar103);
                    auVar67._8_4_ =
                         (int)((float)((uint)fVar105 & 0x80000000 | 0x3f000000) + fVar105);
                    auVar67._12_4_ =
                         (int)((float)((uint)fVar108 & 0x80000000 | 0x3f000000) + fVar108);
                    auVar101._0_4_ =
                         (int)((float)((uint)fVar109 & 0x80000000 | 0x3f000000) + fVar109);
                    auVar101._4_4_ =
                         (int)((float)((uint)fVar126 & 0x80000000 | 0x3f000000) + fVar126);
                    auVar101._8_4_ =
                         (int)((float)((uint)fVar129 & 0x80000000 | 0x3f000000) + fVar129);
                    auVar101._12_4_ =
                         (int)((float)((uint)fVar130 & 0x80000000 | 0x3f000000) + fVar130);
                    auVar140 = packssdw(auVar67,auVar101);
                    sVar152 = auVar140._0_2_;
                    uVar64 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._2_2_;
                    uVar69 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._4_2_;
                    uVar70 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._6_2_;
                    uVar71 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._8_2_;
                    uVar72 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._10_2_;
                    uVar74 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    sVar152 = auVar140._12_2_;
                    sVar78 = auVar140._14_2_;
                    uVar75 = (ushort)(0x7f < sVar152) * 0x7f | (ushort)(0x7f >= sVar152) * sVar152;
                    uVar77 = (ushort)(0x7f < sVar78) * 0x7f | (ushort)(0x7f >= sVar78) * sVar78;
                    auVar68._0_2_ =
                         (ushort)((short)uVar64 < -0x7f) * -0x7f | ((short)uVar64 >= -0x7f) * uVar64
                    ;
                    auVar68._2_2_ =
                         (ushort)((short)uVar69 < -0x7f) * -0x7f | ((short)uVar69 >= -0x7f) * uVar69
                    ;
                    auVar68._4_2_ =
                         (ushort)((short)uVar70 < -0x7f) * -0x7f | ((short)uVar70 >= -0x7f) * uVar70
                    ;
                    auVar68._6_2_ =
                         (ushort)((short)uVar71 < -0x7f) * -0x7f | ((short)uVar71 >= -0x7f) * uVar71
                    ;
                    auVar68._8_2_ =
                         (ushort)((short)uVar72 < -0x7f) * -0x7f | ((short)uVar72 >= -0x7f) * uVar72
                    ;
                    auVar68._10_2_ =
                         (ushort)((short)uVar74 < -0x7f) * -0x7f | ((short)uVar74 >= -0x7f) * uVar74
                    ;
                    auVar68._12_2_ =
                         (ushort)((short)uVar75 < -0x7f) * -0x7f | ((short)uVar75 >= -0x7f) * uVar75
                    ;
                    auVar68._14_2_ =
                         (ushort)((short)uVar77 < -0x7f) * -0x7f | ((short)uVar77 >= -0x7f) * uVar77
                    ;
                    auVar140 = packsswb(auVar68,auVar68);
                    *(long *)*pauVar60 = auVar140._0_8_;
                    pauVar60 = (undefined1 (*) [16])((long)*pauVar60 + 8);
                  }
                  bVar62 = iVar61 != iVar43;
                  iVar61 = iVar61 + 1;
                } while (bVar62);
              }
              bVar62 = iVar58 != (int)local_1f0;
              iVar58 = iVar58 + 1;
            } while (bVar62);
          }
          local_1f8 = (pointer)((long)local_1f8 + 1);
          local_2c8 = (ulong)((uint)local_2c8 + iVar52);
        } while (local_1f8 != local_260);
      }
      local_2b0 = top_blob;
      if ((pointer)local_318._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_318._0_8_,
                        CONCAT44(local_318._20_4_,local_318._16_4_) - local_318._0_8_);
      }
      iVar61 = 0;
      top_blob = local_2b0;
      local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if ((int)local_200 != 1) goto LAB_003f867d;
    }
    p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
    iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var54);
    uVar156 = local_f8._0_4_;
    if ((long)iVar52 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var54) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var54) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var54) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var54) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var54) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var54) < 2)) {
        if (iVar45 < 0x65) {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_4_ = 0;
          local_318._20_4_ = 0;
          p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
            lVar47 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar55 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54) + lVar47 * 4
                                         ));
              local_258.data = (void *)CONCAT44(local_258.data._4_4_,fVar55);
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_258);
              }
              else {
                *(float *)local_318._8_8_ = fVar55;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
            } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s1_int8_dequant_sse
                    (&local_2a8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var54),&local_a8,opt_00);
        }
        else {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_4_ = 0;
          local_318._20_4_ = 0;
          p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
            lVar47 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar55 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4);
              fVar83 = 0.0;
              if (fVar55 != 0.0) {
                fVar83 = 1.0 / (fVar55 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54) +
                                                   lVar47 * 4));
              }
              local_258.data = (void *)CONCAT44(local_258.data._4_4_,fVar83);
              local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var54) +
                                             lVar47 * 4));
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_258);
              }
              else {
                *(float *)local_318._8_8_ = fVar83;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_1e8);
              }
              else {
                *(float *)local_318._8_8_ = local_1e8._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
            } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s1_int8_requant_sse
                    (&local_2a8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var54),&local_90,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_318._0_8_,
                          CONCAT44(local_318._20_4_,local_318._16_4_) - local_318._0_8_);
        }
        pLVar56 = this->activation;
      }
      else {
        if ((((iVar52 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var54) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var54) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var54) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var54) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var54) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var54))) goto LAB_003f8082;
        if (iVar45 < 0x65) {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_4_ = 0;
          local_318._20_4_ = 0;
          p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
            lVar47 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar55 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4)
                             * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54) + lVar47 * 4
                                         ));
              local_258.data = (void *)CONCAT44(local_258.data._4_4_,fVar55);
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_258);
              }
              else {
                *(float *)local_318._8_8_ = fVar55;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
            } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s2_int8_dequant_sse
                    (&local_2a8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var54),&local_d8,opt_00);
        }
        else {
          local_318._0_8_ = (pointer)0x0;
          local_318._8_8_ = (Allocator *)0x0;
          local_318._16_4_ = 0;
          local_318._20_4_ = 0;
          p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var54)) {
            lVar47 = 0;
            local_318._8_8_ = (float *)0x0;
            do {
              fVar55 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4);
              fVar83 = 0.0;
              if (fVar55 != 0.0) {
                fVar83 = 1.0 / (fVar55 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54) +
                                                   lVar47 * 4));
              }
              local_258.data = (void *)CONCAT44(local_258.data._4_4_,fVar83);
              local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var54) +
                                             lVar47 * 4));
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_258);
              }
              else {
                *(float *)local_318._8_8_ = fVar83;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              if ((float *)local_318._8_8_ == (float *)CONCAT44(local_318._20_4_,local_318._16_4_))
              {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_318,
                           (iterator)local_318._8_8_,(float *)&local_1e8);
              }
              else {
                *(float *)local_318._8_8_ = local_1e8._0_4_;
                local_318._8_8_ = local_318._8_8_ + 4;
              }
              lVar47 = lVar47 + 1;
              p_Var54 = this->_vptr_ConvolutionDepthWise_x86[-3];
            } while (lVar47 < *(int *)(&this->field_0x108 + (long)p_Var54));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_318);
          convdw3x3s2_int8_requant_sse
                    (&local_2a8,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var54),&local_c0,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_318._0_8_,
                          CONCAT44(local_318._20_4_,local_318._16_4_) - local_318._0_8_);
        }
        pLVar56 = this->activation;
      }
      iVar61 = 0;
      if (pLVar56 != (Layer *)0x0) {
        (*pLVar56->_vptr_Layer[9])(pLVar56,top_blob,opt);
      }
    }
    else {
LAB_003f8082:
      __n = (long)*(int *)(&this->field_0xd8 + (long)p_Var54) * (long)iVar52;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_318,__n,(allocator_type *)&local_258);
      uVar40 = local_318._0_8_;
      pp_Var9 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var54 = pp_Var9[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var54)) {
        iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar58 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var54);
        iVar53 = 0;
        fVar55 = 0.0;
        iVar57 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var9[-3])) {
            lVar47 = 0;
            do {
              *(float *)(local_318._0_8_ + (iVar57 + lVar47) * 4) = fVar55;
              fVar55 = (float)((int)fVar55 + *(int *)(&this->field_0xdc + (long)pp_Var9[-3]));
              lVar47 = lVar47 + 1;
            } while ((int)lVar47 < *(int *)(&this->field_0xd4 + (long)pp_Var9[-3]));
            iVar57 = iVar57 + (int)lVar47;
          }
          fVar55 = (float)((int)fVar55 + (uVar156 * iVar52 - iVar58 * iVar61));
          iVar53 = iVar53 + 1;
        } while (iVar53 < *(int *)(&this->field_0xd8 + (long)pp_Var9[-3]));
      }
      local_e0 = this->_vptr_ConvolutionDepthWise_x86;
      local_2b0 = top_blob;
      if (0 < *(int *)(&this->field_0x108 + (long)local_e0[-3])) {
        local_330 = (int)__n;
        local_e8 = (long)local_330;
        local_208 = 0;
        lVar47 = 0;
        do {
          lVar44 = local_208;
          if (-1 < (int)local_1f0) {
            local_1f8 = (pointer)(local_2a8.cstep * lVar47 *
                                  CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize)
                                 + (long)local_2a8.data);
            local_328 = (float *)(local_2b0->elemsize * lVar47 * local_2b0->cstep +
                                 (long)local_2b0->data);
            local_2c0 = this->_vptr_ConvolutionDepthWise_x86;
            local_200 = (long)local_2a8.w *
                        CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
            pvVar10 = (this->weight_data_tm).data;
            local_260 = (pointer)0x0;
            local_2b8 = local_328;
            do {
              if (-1 < iVar43) {
                local_2c8 = (ulong)(int)local_260;
                iVar52 = 0;
                do {
                  p_Var54 = local_2c0[-3];
                  auVar79 = ZEXT812(0);
                  fVar55 = 0.0;
                  if (0 < local_330) {
                    uVar50 = 0;
                    iVar58 = 0;
                    do {
                      iVar58 = iVar58 + (int)*(char *)((long)pvVar10 + uVar50 + lVar44) *
                                        (int)*(char *)((long)local_1f8 +
                                                      (long)(int)*(pointer)(uVar40 + uVar50 * 4) +
                                                      (long)*(int *)(&this->field_0xe8 +
                                                                    (long)p_Var54) * local_2c8 *
                                                      local_200 +
                                                      (long)iVar52 *
                                                      (long)*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var54));
                      uVar50 = uVar50 + 1;
                    } while ((__n & 0xffffffff) != uVar50);
                    fVar55 = (float)iVar58;
                  }
                  fVar83 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var54) + lVar47 * 4);
                  if (fVar83 != 0.0) {
                    auVar79._4_8_ = 0;
                    auVar79._0_4_ =
                         1.0 / (fVar83 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var54) +
                                                   lVar47 * 4));
                  }
                  uVar50 = auVar79._4_8_;
                  fVar55 = auVar79._0_4_ * fVar55;
                  if (*(int *)(&this->field_0x100 + (long)p_Var54) != 0) {
                    fVar55 = fVar55 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var54) +
                                                lVar47 * 4);
                  }
                  auVar80._4_8_ = uVar50;
                  auVar80._0_4_ = fVar55;
                  auVar81._12_4_ = 0;
                  auVar81._0_12_ = auVar80;
                  if (*(int *)(&this->field_0x110 + (long)p_Var54) - 1U < 6) {
                    auVar84._8_4_ = 0;
                    auVar84._0_8_ = uVar50;
                    switch(*(int *)(&this->field_0x110 + (long)p_Var54)) {
                    case 1:
                      if (fVar55 <= 0.0) {
                        auVar15._12_4_ = 0;
                        auVar15._0_12_ = auVar84;
                        auVar81 = auVar15 << 0x20;
                      }
                      goto LAB_003f8314;
                    case 2:
                      fVar83 = (float)(-(uint)(0.0 < fVar55) & 0x3f800000 |
                                      ~-(uint)(0.0 < fVar55) &
                                      **(uint **)(&this->field_0x118 + (long)p_Var54)) * fVar55;
                      break;
                    case 3:
                      fVar83 = **(float **)(&this->field_0x118 + (long)p_Var54);
                      if (fVar55 <= fVar83) {
                        auVar81._4_8_ = uVar50;
                        auVar81._0_4_ = fVar83;
                        auVar81._12_4_ = 0;
                      }
                      fVar83 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                      if (auVar81._0_4_ <= fVar83) {
                        fVar83 = auVar81._0_4_;
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar55) {
                        auVar82._4_12_ = auVar84;
                        auVar82._0_4_ = 0x42b0c0a5;
                        auVar80 = auVar82._0_12_;
                      }
                      uVar51 = -(uint)(auVar80._0_4_ < -88.37626);
                      fVar55 = expf((float)(uVar51 & 0x42b0c0a5 | ~uVar51 & (uint)-auVar80._0_4_));
                      fVar83 = 1.0 / (fVar55 + 1.0);
                      break;
                    case 5:
                      local_f8 = auVar81;
                      fVar55 = expf(fVar55);
                      fVar55 = logf(fVar55 + 1.0);
                      fVar55 = tanhf(fVar55);
                      fVar83 = fVar55 * (float)local_f8._0_4_;
                      break;
                    case 6:
                      fVar85 = **(float **)(&this->field_0x118 + (long)p_Var54);
                      fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                      fVar103 = -fVar87 / fVar85;
                      fVar83 = 0.0;
                      if (fVar103 <= fVar55) {
                        if (fVar103 + 1.0 / fVar85 < fVar55) goto LAB_003f8314;
                        fVar83 = (fVar85 * fVar55 + fVar87) * fVar55;
                      }
                    }
                  }
                  else {
LAB_003f8314:
                    fVar83 = auVar81._0_4_;
                  }
                  if (iVar45 < 0x65) {
                    *local_2b8 = fVar83;
                    local_2b8 = local_2b8 + 1;
                  }
                  else {
                    fVar55 = roundf(fVar83 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var54
                                                                 ) + lVar47 * 4));
                    iVar58 = (int)fVar55;
                    if (iVar58 < -0x7e) {
                      iVar58 = -0x7f;
                    }
                    uVar41 = (undefined1)iVar58;
                    if (0x7e < iVar58) {
                      uVar41 = 0x7f;
                    }
                    *(undefined1 *)local_328 = uVar41;
                    local_328 = (float *)((long)local_328 + 1);
                  }
                  bVar62 = iVar52 != iVar43;
                  iVar52 = iVar52 + 1;
                } while (bVar62);
              }
              iVar52 = (int)local_260;
              local_260 = (pointer)(ulong)(iVar52 + 1);
            } while (iVar52 != (int)local_1f0);
          }
          lVar47 = lVar47 + 1;
          local_208 = local_208 + local_e8;
        } while (lVar47 < *(int *)(&this->field_0x108 + (long)local_e0[-3]));
      }
      if ((pointer)local_318._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_318._0_8_,
                        CONCAT44(local_318._20_4_,local_318._16_4_) - local_318._0_8_);
      }
      iVar61 = 0;
      local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
    }
    goto LAB_003f867d;
  }
  iVar43 = *(int *)(&this->field_0x10c + (long)p_Var54);
  local_2c8 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar43 < 0x65) {
      local_2c8 = (ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var54) & 3) == 0) * 3 + 1);
    }
    else {
      local_2c8 = 1;
      if ((*(uint *)(&this->field_0xd0 + (long)p_Var54) & 7) == 0) {
        local_2c8 = 8;
      }
    }
  }
  iVar45 = (int)local_2c8;
  uVar50 = (ulong)(uint)(iVar45 * 4);
  if (100 < iVar43) {
    uVar50 = local_2c8;
  }
  Mat::create(top_blob,iVar52,iVar58,*(int *)(&this->field_0xd0 + (long)p_Var54) / iVar45,uVar50,
              iVar45,opt->blob_allocator);
  auVar81 = local_2e8;
  local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if ((top_blob->data == (void *)0x0) ||
     (local_318._8_8_ = (Allocator *)CONCAT44(local_318._12_4_,local_318._8_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_003f867d;
  uVar51 = (int)uVar51 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  local_2b8 = (float *)CONCAT44(local_2b8._4_4_,uVar51);
  uVar42 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  local_2c0 = (_func_int **)CONCAT44(local_2c0._4_4_,uVar42);
  iVar45 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar45 = 1;
    if ((uVar51 & 7) == 0) {
      iVar45 = 8;
    }
    if (iVar43 < 0x65) {
      _elempack = (uint)((uVar42 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar42 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  local_318._0_8_ = local_2a8.data;
  local_318._8_4_ = local_2a8.refcount._0_4_;
  local_318._12_4_ = local_2a8.refcount._4_4_;
  local_318._16_4_ = (undefined4)local_2a8.elemsize;
  local_318._20_4_ = local_2a8.elemsize._4_4_;
  local_318._24_4_ = local_2a8.elempack;
  local_318._32_8_ = local_2a8.allocator;
  local_318._44_4_ = local_2a8.w;
  local_318._40_4_ = local_2a8.dims;
  local_2e8._4_4_ = local_2a8.d;
  local_2e8._0_4_ = local_2a8.h;
  local_2e8._12_4_ = auVar81._12_4_;
  local_2e8._8_4_ = local_2a8.c;
  local_2d8 = local_2a8.cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  if (iVar45 < (int)local_200) {
    local_258.data = *(void **)opt;
    uVar24 = opt->openmp_blocktime;
    uVar25 = opt->use_winograd_convolution;
    uVar27 = opt->use_sgemm_convolution;
    uVar29 = opt->use_int8_inference;
    uVar31 = opt->use_vulkan_compute;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar26 = CONCAT31(uVar28,uVar25);
    local_258.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_258._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_258._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_258.c._0_1_ = opt->use_winograd43_convolution;
    local_258.c._1_1_ = opt->use_winograd63_convolution;
    local_258.c._2_1_ = opt->use_a53_a55_optimized_kernel;
    local_258.c._3_1_ = opt->use_reserved_7;
    local_258._60_1_ = opt->use_reserved_8;
    local_258._61_1_ = opt->use_reserved_9;
    local_258._62_1_ = opt->use_reserved_10;
    local_258._63_1_ = opt->use_reserved_11;
    local_258.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_258.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_258.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_258.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_258.elempack = uVar24;
    local_258._28_4_ = uVar26;
    convert_packing(&local_2a8,(Mat *)local_318,iVar45,(Option *)&local_258);
  }
  local_258.data = top_blob->data;
  piVar8 = top_blob->refcount;
  local_258.refcount._0_4_ = SUB84(piVar8,0);
  local_258.refcount._4_4_ = (undefined4)((ulong)piVar8 >> 0x20);
  local_258.elemsize._0_4_ = (undefined4)top_blob->elemsize;
  local_258.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
  local_258.elempack = top_blob->elempack;
  local_258.allocator = top_blob->allocator;
  local_258.dims = top_blob->dims;
  local_258.w = top_blob->w;
  local_258.h = top_blob->h;
  local_258.d = top_blob->d;
  local_258.c = top_blob->c;
  local_258.cstep = top_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
  }
  if (_elempack < (uint)local_2c8) {
    Mat::create(&local_258,iVar52,iVar58,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)_elempack,(ulong)((int)(uVar50 / (local_2c8 & 0xffffffff)) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar61 = -100;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0))
    goto LAB_003f7ac6;
  }
  else {
LAB_003f7ac6:
    local_2b0 = top_blob;
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])) {
      iVar43 = (int)local_2b8 / iVar45;
      iVar58 = (int)local_2c0 / (int)_elempack;
      iVar61 = 0;
      iVar52 = 0;
      lVar47 = 0;
      do {
        local_1a8 = CONCAT44(local_318._20_4_,local_318._16_4_);
        local_1e8 = (pointer)((long)(iVar61 / iVar45) * local_2d8 * local_1a8 + local_318._0_8_);
        uStack_1e0 = 0;
        uStack_1dc = 0;
        local_1d8 = local_318._16_4_;
        uStack_1d4 = local_318._20_4_;
        local_1d0 = local_318._24_4_;
        local_1c8 = (Allocator *)local_318._32_8_;
        uStack_1b8 = local_2e8._0_8_;
        local_1a8 = ((long)(int)local_2e8._4_4_ * local_1a8 *
                     (long)(int)local_2e8._0_4_ * (long)(int)local_318._44_4_ + 0xf &
                    0xfffffffffffffff0) / local_1a8;
        local_1c0._0_4_ = local_318._40_4_;
        local_1c0._4_4_ = local_318._44_4_;
        lVar48 = (long)local_258.h;
        local_158 = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
        local_198 = (void *)((long)(iVar52 / (int)_elempack) * local_258.cstep * local_158 +
                            (long)local_258.data);
        uStack_190 = 0;
        uStack_18c = 0;
        local_188 = (undefined4)local_258.elemsize;
        uStack_184 = local_258.elemsize._4_4_;
        local_180 = local_258.elempack;
        local_178 = local_258.allocator;
        lVar44 = (long)local_258.d;
        uStack_168._0_4_ = local_258.h;
        uStack_168._4_4_ = local_258.d;
        local_158 = (lVar44 * local_158 * lVar48 * local_258.w + 0xf & 0xfffffffffffffff0) /
                    local_158;
        local_170._0_4_ = local_258.dims;
        local_170._4_4_ = local_258.w;
        pLVar56 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar47];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_54._0_1_ = opt->use_int8_packed;
        uStack_54._1_1_ = opt->use_int8_storage;
        uStack_54._2_1_ = opt->use_int8_arithmetic;
        uStack_54._3_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_4c._0_1_ = opt->use_subgroup_shuffle;
        uStack_4c._1_1_ = opt->use_image_storage;
        uStack_4c._2_1_ = opt->use_tensor_storage;
        uStack_4c._3_1_ = opt->use_reserved_0;
        local_48._0_4_ = opt->flush_denormals;
        local_48._4_1_ = opt->use_local_pool_allocator;
        local_48._5_1_ = opt->use_shader_local_memory;
        local_48._6_1_ = opt->use_cooperative_matrix;
        local_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_258.allocator;
        local_1b0 = iVar43;
        local_160 = iVar58;
        (*pLVar56->_vptr_Layer[7])(pLVar56,&local_1e8,&local_198,&local_78);
        piVar8 = (int *)CONCAT44(uStack_18c,uStack_190);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_178 == (Allocator *)0x0) {
              if (local_198 != (void *)0x0) {
                free(local_198);
              }
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        local_158 = 0;
        local_198 = (void *)0x0;
        uStack_190 = 0;
        uStack_18c = 0;
        local_188 = 0;
        uStack_184 = 0;
        local_180 = 0;
        local_170 = 0;
        uStack_168 = 0;
        local_160 = 0;
        piVar8 = (int *)CONCAT44(uStack_1dc,uStack_1e0);
        if (piVar8 != (int *)0x0) {
          LOCK();
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            if (local_1c8 == (Allocator *)0x0) {
              if (local_1e8 != (pointer)0x0) {
                free(local_1e8);
              }
            }
            else {
              (*local_1c8->_vptr_Allocator[3])();
            }
          }
        }
        local_1a8 = 0;
        local_1e8 = (pointer)0x0;
        uStack_1e0 = 0;
        uStack_1dc = 0;
        local_1d8 = 0;
        uStack_1d4 = 0;
        local_1d0 = 0;
        local_1c0 = 0;
        uStack_1b8 = 0;
        local_1b0 = 0;
        lVar47 = lVar47 + 1;
        iVar52 = iVar52 + (int)local_2c0;
        iVar61 = iVar61 + (int)local_2b8;
      } while (lVar47 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    pMVar39 = local_2b0;
    if (_elempack < (uint)local_2c8) {
      iVar61 = 0;
      convert_packing(&local_258,local_2b0,(uint)local_2c8,opt);
    }
    else if (&local_258 == local_2b0) {
      iVar61 = 0;
    }
    else {
      piVar8 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      piVar8 = local_2b0->refcount;
      iVar61 = 0;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_2b0->allocator == (Allocator *)0x0) {
            if (local_2b0->data != (void *)0x0) {
              free(local_2b0->data);
            }
          }
          else {
            (*local_2b0->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar39->cstep = 0;
      pMVar39->data = (void *)0x0;
      pMVar39->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar39->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar39->elemsize + 4) = 0;
      pMVar39->dims = 0;
      pMVar39->w = 0;
      pMVar39->h = 0;
      pMVar39->d = 0;
      pMVar39->c = 0;
      pMVar39->data = local_258.data;
      pMVar39->refcount = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      pMVar39->elemsize = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
      pMVar39->elempack = local_258.elempack;
      pMVar39->allocator = local_258.allocator;
      pMVar39->dims = local_258.dims;
      pMVar39->w = local_258.w;
      pMVar39->h = local_258.h;
      pMVar39->d = local_258.d;
      pMVar39->c = local_258.c;
      pMVar39->cstep = local_258.cstep;
    }
  }
  piVar8 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        if (local_258.data != (void *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_258.cstep = 0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258.elemsize._4_4_ = 0;
  local_258.elempack = 0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258._56_8_ = local_258._56_8_ & 0xffffffff00000000;
  piVar8 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_318._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_318._0_8_ != (pointer)0x0) {
          free((void *)local_318._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_318._32_8_)[3])();
      }
    }
  }
  local_2d8 = 0;
  local_318._0_8_ = (pointer)0x0;
  local_318._8_8_ = (Allocator *)0x0;
  local_318._16_4_ = 0;
  local_318._20_4_ = 0;
  local_318._24_4_ = 0;
  local_318._40_4_ = 0;
  local_318._44_4_ = 0;
  local_2e8._0_12_ = ZEXT812(0);
LAB_003f867d:
  piVar8 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        if ((pointer)local_2a8.data != (pointer)0x0) {
          free(local_2a8.data);
        }
      }
      else {
        (*(local_2a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize._0_4_ = 0;
  local_2a8.elemsize._4_4_ = 0;
  local_2a8.elempack = 0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  piVar8 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar61;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}